

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxUtils::Texture1D::generate
          (Texture1D *this,RenderContext *context,IVec3 *size,GLenum format,GLenum type,
          bool generateMipmaps)

{
  PtrData<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_> data;
  GLenum dataType;
  IVec3 *context_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  Texture1D *pTVar3;
  int *piVar4;
  Texture1D *pTVar5;
  PixelBufferAccess *access;
  Texture1D *in_stack_ffffffffffffff28;
  code *pcVar6;
  undefined8 in_stack_ffffffffffffff30;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  DefaultDeleter<glu::Texture1D> local_65 [13];
  PtrData<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_> local_58;
  PtrData<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_> *local_48;
  long local_38;
  Functions *gl;
  GLenum local_28;
  GLenum GStack_24;
  bool generateMipmaps_local;
  GLenum type_local;
  GLenum format_local;
  IVec3 *size_local;
  RenderContext *context_local;
  Texture1D *this_local;
  
  gl._7_1_ = generateMipmaps;
  local_28 = type;
  GStack_24 = format;
  _type_local = size;
  size_local = (IVec3 *)context;
  context_local = (RenderContext *)this;
  iVar1 = (*context->_vptr_RenderContext[3])();
  local_38 = CONCAT44(extraout_var,iVar1);
  pTVar3 = (Texture1D *)operator_new(0x68);
  context_00 = size_local;
  dVar2 = GStack_24;
  dataType = local_28;
  piVar4 = tcu::Vector<int,_3>::x(size);
  glu::Texture1D::Texture1D(pTVar3,(RenderContext *)context_00,dVar2,dataType,*piVar4);
  de::DefaultDeleter<glu::Texture1D>::DefaultDeleter(local_65);
  de::details::MovePtr<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>::MovePtr();
  local_48 = de::details::MovePtr::operator_cast_to_PtrData(&local_58,(MovePtr *)pTVar3);
  data._8_8_ = in_stack_ffffffffffffff30;
  data.ptr = in_stack_ffffffffffffff28;
  de::details::MovePtr<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>::operator=
            (&this->m_texture,data);
  de::details::MovePtr<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>::~MovePtr
            ((MovePtr<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_> *)&local_58);
  pTVar3 = de::details::UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>);
  pTVar5 = glu::Texture1D::getRefTexture(pTVar3);
  tcu::Texture1D::allocLevel(pTVar5,0);
  if ((gl._7_1_ & 1) != 0) {
    pTVar3 = de::details::UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>::
             operator->(&(this->m_texture).
                         super_UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>);
    pTVar5 = glu::Texture1D::getRefTexture(pTVar3);
    tcu::Texture1D::allocLevel(pTVar5,1);
  }
  dVar2 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar2,"glu::Texture1D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0xe6);
  pTVar3 = de::details::UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>);
  pTVar5 = glu::Texture1D::getRefTexture(pTVar3);
  access = tcu::TextureLevelPyramid::getLevel(&pTVar5->super_TextureLevelPyramid,0);
  tcu::Vector<float,_4>::Vector(&local_78,1.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_88,0.0,0.0,0.0,1.0);
  tcu::fillWithGrid(access,4,&local_78,&local_88);
  dVar2 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar2,"glu::Texture1D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0xea);
  pTVar3 = de::details::UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>);
  glu::Texture1D::upload(pTVar3);
  dVar2 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar2,"glu::Texture1D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0xed);
  if ((gl._7_1_ & 1) != 0) {
    pcVar6 = *(code **)(local_38 + 0x720);
    pTVar3 = de::details::UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>::
             operator->(&(this->m_texture).
                         super_UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>);
    dVar2 = glu::Texture1D::getGLTexture(pTVar3);
    (*pcVar6)(dVar2);
  }
  (**(code **)(local_38 + 8))(0x84c0);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::Texture1D::generate(const glu::RenderContext& context, tcu::IVec3 size,
												   glw::GLenum format, glw::GLenum type, bool generateMipmaps)
{
	const glw::Functions& gl = context.getFunctions();

	m_texture = de::MovePtr<glu::Texture1D>(new glu::Texture1D(context, format, type, size.x()));

	m_texture->getRefTexture().allocLevel(0);
	if (generateMipmaps)
	{
		m_texture->getRefTexture().allocLevel(1);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1D error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 4, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1D error occurred");

	m_texture->upload();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1D error occurred");

	if (generateMipmaps)
	{
		gl.generateTextureMipmap(m_texture->getGLTexture());
	}

	gl.activeTexture(GL_TEXTURE0);
}